

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:1005:13),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:1007:6)>
::getImpl(TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:1005:13),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:1007:6)>
          *this,ExceptionOrValue *output)

{
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *exception;
  long *plVar1;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
  depResult;
  ExceptionOrValue local_328;
  char local_1c8;
  ExceptionOrValue local_1c0;
  char local_60;
  undefined8 *local_28;
  long *local_20;
  
  local_1c0.exception.ptr.isSet = false;
  local_60 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1c0);
  exception = &local_1c0.exception.ptr.field_1;
  if (local_1c0.exception.ptr.isSet == true) {
    *(this->errorHandler).returned = true;
    throwRecoverableException(&exception->value,0);
    local_328.exception.ptr.isSet = false;
    local_1c8 = '\x01';
    ExceptionOrValue::operator=(output,&local_328);
  }
  else {
    if (local_60 != '\x01') goto LAB_002fcb50;
    *(this->func).returned = true;
    local_328.exception.ptr.isSet = false;
    local_1c8 = '\x01';
    ExceptionOrValue::operator=(output,&local_328);
  }
  if (&local_328 != output) {
    if (output[1].exception.ptr.isSet == true) {
      output[1].exception.ptr.isSet = false;
    }
    if (local_1c8 == '\x01') {
      output[1].exception.ptr.isSet = true;
    }
  }
  if (local_328.exception.ptr.isSet == true) {
    Exception::~Exception(&local_328.exception.ptr.field_1.value);
  }
LAB_002fcb50:
  plVar1 = local_20;
  if ((local_60 == '\x01') && (local_20 != (long *)0x0)) {
    local_20 = (long *)0x0;
    (**(code **)*local_28)(local_28,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  if (local_1c0.exception.ptr.isSet == true) {
    Exception::~Exception(&exception->value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }